

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

ResendRequest *
anon_unknown.dwarf_5319c9::createT11ResendRequest
          (ResendRequest *__return_storage_ptr__,char *sender,char *target,int seq,int begin,int end
          )

{
  undefined1 *this;
  int iVar1;
  FieldBase local_70;
  
  FIXT11::ResendRequest::ResendRequest(__return_storage_ptr__);
  FIX::UInt64Field::UInt64Field((UInt64Field *)&local_70,7,(ulong)target & 0xffffffff);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0032a018;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::UInt64Field::UInt64Field((UInt64Field *)&local_70,0x10,2);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0032a050;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)&local_70,9,iVar1);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327ea8;
  FIX::FieldMap::setField((FieldMap *)this,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_70,10,iVar1);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00328060;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  return __return_storage_ptr__;
}

Assistant:

FIXT11::ResendRequest createT11ResendRequest(const char *sender, const char *target, int seq, int begin, int end) {
  FIXT11::ResendRequest resendRequest;
  resendRequest.set(BeginSeqNo(begin));
  resendRequest.set(EndSeqNo(end));
  fillHeader(resendRequest.getHeader(), sender, target, seq);
  resendRequest.getHeader().setField(BodyLength(resendRequest.bodyLength()));
  resendRequest.getTrailer().setField(CheckSum(resendRequest.checkSum()));
  return resendRequest;
}